

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status fdb_iterator_get_metaonly(fdb_iterator *iterator,fdb_doc **doc)

{
  long lVar1;
  bool bVar2;
  fdb_status fVar3;
  ulong keylen;
  int64_t iVar4;
  long *in_RSI;
  long *in_RDI;
  bool alloced_meta;
  bool alloced_key;
  size_t size_chunk;
  docio_handle *dhandle;
  int64_t _offset;
  uint64_t offset;
  fdb_status ret;
  docio_object _doc;
  undefined8 in_stack_ffffffffffffff78;
  undefined2 uVar5;
  memory_order order;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar7;
  void *key;
  fdb_doc **in_stack_ffffffffffffff98;
  ushort in_stack_ffffffffffffffb0;
  ushort in_stack_ffffffffffffffb2;
  uint in_stack_ffffffffffffffb4;
  byte local_44;
  void *local_38;
  undefined8 local_30;
  void *local_28;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    docio_object::docio_object
              ((docio_object *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))));
    keylen = (ulong)*(ushort *)(*in_RDI + 0x70);
    key = (void *)in_RDI[0x11];
    if ((key == (void *)0x0) || (in_RDI[0x12] == -1)) {
      local_4 = FDB_RESULT_ITERATOR_FAIL;
    }
    else {
      bVar2 = atomic_cas_uint8_t((atomic<unsigned_char> *)
                                 CONCAT17(in_stack_ffffffffffffff87,
                                          CONCAT16(in_stack_ffffffffffffff86,
                                                   CONCAT24(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80))),
                                 (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                                 (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
      if (bVar2) {
        lVar1 = in_RDI[0x12];
        if (*in_RSI == 0) {
          in_stack_ffffffffffffff78 = 0;
          fVar3 = fdb_doc_create(in_stack_ffffffffffffff98,key,keylen,
                                 (void *)CONCAT17(in_stack_ffffffffffffff87,
                                                  CONCAT16(in_stack_ffffffffffffff86,
                                                           CONCAT24(in_stack_ffffffffffffff84,
                                                                    in_stack_ffffffffffffff80))),0,
                                 (void *)0x15da69,
                                 CONCAT44(in_stack_ffffffffffffffb4,
                                          CONCAT22(in_stack_ffffffffffffffb2,
                                                   in_stack_ffffffffffffffb0)));
          if (fVar3 != FDB_RESULT_SUCCESS) {
            atomic_cas_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff87,
                                        CONCAT16(in_stack_ffffffffffffff86,
                                                 CONCAT24(in_stack_ffffffffffffff84,
                                                          in_stack_ffffffffffffff80))),
                               (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                               (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
            return fVar3;
          }
          local_38 = (void *)0x0;
          in_stack_ffffffffffffffb0 = 0;
          local_28 = (void *)0x0;
          bVar7 = true;
          bVar6 = 1;
        }
        else {
          local_38 = *(void **)(*in_RSI + 0x20);
          local_28 = *(void **)(*in_RSI + 0x38);
          bVar7 = local_38 == (void *)0x0;
          bVar6 = -(local_28 == (void *)0x0) & 1;
        }
        iVar4 = docio_read_doc_key_meta
                          ((docio_handle *)_doc.field_3,(uint64_t)_doc.key,
                           (docio_object *)_doc._16_8_,_doc.length.reserved._1_1_);
        order = (memory_order)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (iVar4 < 1) {
          atomic_cas_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(bVar7,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                                    in_stack_ffffffffffffff80))),
                             (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                             (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
          fdb_doc_free((fdb_doc *)0x15db66);
          *in_RSI = 0;
          if (iVar4 < 0) {
            local_4 = (fdb_status)iVar4;
          }
          else {
            local_4 = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
        else if (((local_44 & 4) == 0) || ((*(ushort *)(in_RDI + 0xd) & 2) == 0)) {
          if (*(long *)(*in_RDI + 0x18) != 0) {
            in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 - (short)keylen;
            memmove(local_38,(void *)((long)local_38 + keylen),(ulong)in_stack_ffffffffffffffb0);
          }
          if ((bVar7 & 1) != 0) {
            *(void **)(*in_RSI + 0x20) = local_38;
          }
          if ((bVar6 & 1) != 0) {
            *(void **)(*in_RSI + 0x38) = local_28;
          }
          *(ulong *)*in_RSI = (ulong)in_stack_ffffffffffffffb0;
          *(ulong *)(*in_RSI + 8) = (ulong)in_stack_ffffffffffffffb2;
          *(ulong *)(*in_RSI + 0x10) = (ulong)in_stack_ffffffffffffffb4;
          *(undefined8 *)(*in_RSI + 0x28) = local_30;
          *(bool *)(*in_RSI + 0x48) = (local_44 & 4) != 0;
          *(long *)(*in_RSI + 0x30) = lVar1;
          atomic_cas_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(bVar7,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                                    in_stack_ffffffffffffff80))),
                             (uint8_t)(order >> 0x18),(uint8_t)(order >> 0x10));
          atomic_incr_uint64_t
                    ((atomic<unsigned_long> *)
                     CONCAT17(bVar7,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80))),order);
          local_4 = FDB_RESULT_SUCCESS;
        }
        else {
          if ((bVar7 & 1) != 0) {
            free(local_38);
          }
          uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff78 >> 0x30);
          if ((bVar6 & 1) != 0) {
            free(local_28);
          }
          atomic_cas_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(bVar7,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                                    in_stack_ffffffffffffff80))),
                             (uint8_t)((ushort)uVar5 >> 8),(uint8_t)uVar5);
          local_4 = FDB_RESULT_KEY_NOT_FOUND;
        }
      }
      else {
        local_4 = FDB_RESULT_HANDLE_BUSY;
      }
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_get_metaonly(fdb_iterator *iterator, fdb_doc **doc)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    struct docio_object _doc;
    fdb_status ret = FDB_RESULT_SUCCESS;
    uint64_t offset;
    int64_t _offset;
    struct docio_handle *dhandle;
    size_t size_chunk = iterator->handle->config.chunksize;
    bool alloced_key, alloced_meta;
    LATENCY_STAT_START();

    dhandle = iterator->_dhandle;
    if (!dhandle || iterator->_get_offset == BLK_NOT_FOUND) {
        return FDB_RESULT_ITERATOR_FAIL;
    }

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    offset = iterator->_get_offset;

    if (*doc == NULL) {
        ret = fdb_doc_create(doc, NULL, 0, NULL, 0, NULL, 0);
        if (ret != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
            atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
            return ret;
        } // LCOV_EXCL_STOP
        _doc.key = NULL;
        _doc.length.keylen = 0;
        _doc.meta = NULL;
        _doc.body = NULL;
        alloced_key = true;
        alloced_meta = true;
    } else {
        _doc.key = (*doc)->key;
        _doc.meta = (*doc)->meta;
        _doc.body = NULL;
        alloced_key = _doc.key ? false : true;
        alloced_meta = _doc.meta ? false : true;
    }

    _offset = docio_read_doc_key_meta(dhandle, offset, &_doc, true);
    if (_offset <= 0) {
        atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
        fdb_doc_free(*doc);
        *doc = NULL;
        return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
    }
    if (_doc.length.flag & DOCIO_DELETED &&
            (iterator->opt & FDB_ITR_NO_DELETES)) {
        if (alloced_key) {
            free(_doc.key);
        }
        if (alloced_meta) {
            free(_doc.meta);
        }
        atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
        return FDB_RESULT_KEY_NOT_FOUND;
    }

    if (iterator->handle->kvs) {
        // eliminate KV ID from key
        _doc.length.keylen -= size_chunk;
        memmove(_doc.key, (uint8_t*)_doc.key + size_chunk, _doc.length.keylen);
    }
    if (alloced_key) {
        (*doc)->key = _doc.key;
    }
    if (alloced_meta) {
        (*doc)->meta = _doc.meta;
    }
    (*doc)->keylen = _doc.length.keylen;
    (*doc)->metalen = _doc.length.metalen;
    (*doc)->bodylen = _doc.length.bodylen;
    (*doc)->seqnum = _doc.seqnum;
    (*doc)->deleted = _doc.length.flag & DOCIO_DELETED;
    (*doc)->offset = offset;

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_gets,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_GET_META);
    return ret;
}